

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O2

QList<QPrint::ColorMode> * __thiscall
QPlatformPrintDevice::supportedColorModes
          (QList<QPrint::ColorMode> *__return_storage_ptr__,QPlatformPrintDevice *this)

{
  if (this->m_haveColorModes == false) {
    (*this->_vptr_QPlatformPrintDevice[0x2b])(this);
  }
  QArrayDataPointer<QPrint::ColorMode>::QArrayDataPointer
            (&__return_storage_ptr__->d,&(this->m_colorModes).d);
  return __return_storage_ptr__;
}

Assistant:

QList<QPrint::ColorMode> QPlatformPrintDevice::supportedColorModes() const
{
    if (!m_haveColorModes)
        loadColorModes();
    return m_colorModes;
}